

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O2

void __thiscall
Bech32Test_check_decode_encode_Test::~Bech32Test_check_decode_encode_Test
          (Bech32Test_check_decode_encode_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, check_decode_encode) {
    std::string data("a1lqfn3a");
    bech32::DecodedResult decodedResult = bech32::decode(data);
    ASSERT_EQ(decodedResult.encoding, bech32::Encoding::Bech32m);
    ASSERT_EQ(decodedResult.hrp, "a");
    ASSERT_TRUE(decodedResult.dp.empty());
    std::string enc = bech32::encode(decodedResult.hrp, decodedResult.dp);
    ASSERT_EQ(enc, data);

    data = "abcdef1l7aum6echk45nj3s0wdvt2fg8x9yrzpqzd3ryx";
    decodedResult = bech32::decode(data);
    ASSERT_EQ(decodedResult.encoding, bech32::Encoding::Bech32m);
    ASSERT_EQ(decodedResult.hrp, "abcdef");
    enc = bech32::encode(decodedResult.hrp, decodedResult.dp);
    ASSERT_EQ(enc, data);

    data = "split1checkupstagehandshakeupstreamerranterredcaperredlc445v";
    decodedResult = bech32::decode(data);
    ASSERT_EQ(decodedResult.encoding, bech32::Encoding::Bech32m);
    ASSERT_EQ(decodedResult.hrp, "split");
    enc = bech32::encode(decodedResult.hrp, decodedResult.dp);
    ASSERT_EQ(enc, data);

}